

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O1

QString * __thiscall QFont::defaultFamily(QString *__return_storage_ptr__,QFont *this)

{
  Data *pDVar1;
  long in_FS_OFFSET;
  QString local_58;
  QArrayDataPointer<QString> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  qt_fallbacksForFamily
            ((QStringList *)&local_38,&local_58,StyleNormal,
             (uint)(byte)(((this->d).d.ptr)->request).field_0x64,Script_Common);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((undefined1 *)local_38.size == (undefined1 *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pDVar1 = ((local_38.ptr)->d).d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = ((local_38.ptr)->d).ptr;
    (__return_storage_ptr__->d).size = ((local_38.ptr)->d).size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QFont::defaultFamily() const
{
    const QStringList fallbacks = qt_fallbacksForFamily(QString(),
                                                        QFont::StyleNormal,
                                                        QFont::StyleHint(d->request.styleHint),
                                                        QFontDatabasePrivate::Script_Common);
    if (!fallbacks.isEmpty())
        return fallbacks.first();
    return QString();
}